

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Expression * __thiscall wasm::Builder::makeConstantExpression(Builder *this,Literal *value)

{
  undefined1 auVar1 [8];
  bool bVar2;
  int32_t x;
  int iVar3;
  Const *pCVar4;
  HeapType HVar5;
  Expression *pEVar6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  uint uVar9;
  Literal *pLVar10;
  char *__assertion;
  long lVar11;
  long lVar12;
  long lVar13;
  IString IVar14;
  Expression EVar15;
  uintptr_t local_230;
  stringstream wtf16;
  ostream local_220 [112];
  ios_base local_1b0 [264];
  Literal local_a8;
  Literal local_90;
  Literal *local_78;
  Builder *local_70;
  undefined1 local_68 [8];
  value_type c;
  Type local_40;
  Type type;
  
  local_40.id = (value->type).id;
  if (local_40.id - 2 < 5) {
    ::wasm::Literal::Literal(&local_a8,value);
    pCVar4 = makeConst(this,&local_a8);
    pLVar10 = &local_a8;
LAB_0017430b:
    ::wasm::Literal::~Literal(pLVar10);
    return (Expression *)pCVar4;
  }
  bVar2 = Type::isNull(&value->type);
  if (bVar2) {
    HVar5 = Type::getHeapType(&local_40);
    pEVar6 = (Expression *)makeRefNull(this,HVar5);
    return pEVar6;
  }
  bVar2 = Type::isFunction(&local_40);
  if (bVar2) {
    IVar14.str = (string_view)Literal::getFunc(value);
    Type::getHeapType(&local_40);
    HVar5.id = (uintptr_t)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
    *(undefined1 *)HVar5.id = 0x2b;
    *(undefined8 *)(HVar5.id + 8) = 0;
    ((IString *)(HVar5.id + 0x10))->str = IVar14.str;
    ::wasm::RefFunc::finalize(HVar5);
    return (Expression *)HVar5.id;
  }
  if (((local_40.id & 1) == 0 && 6 < local_40.id) &&
     (HVar5 = Type::getHeapType(&local_40), ((uint)HVar5.id & 0x7b) == 0x30 && HVar5.id < 0x7d)) {
    x = Literal::geti31(value,true);
    pCVar4 = makeConst<int>(this,x);
    local_230 = (uintptr_t)Type::getHeapType(&local_40);
    iVar3 = ::wasm::HeapType::getShared();
    pEVar6 = (Expression *)MixedArena::allocSpace(&this->wasm->allocator,0x18,8);
    pEVar6->_id = RefI31Id;
    *(Const **)(pEVar6 + 1) = pCVar4;
    (pEVar6->type).id = (ulong)(iVar3 == 0) * 4 + 0x30;
    ::wasm::RefI31::finalize();
    return pEVar6;
  }
  bVar2 = Type::isString(&local_40);
  if (bVar2) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230);
    ::wasm::Literal::getGCData();
    auVar1 = local_68;
    local_70 = this;
    if (c.field_0.i64 != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 c.field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    lVar12 = (*(long *)((long)auVar1 + 0x30) - *(long *)((long)auVar1 + 0x28) >> 3) *
             -0x5555555555555555 + *(long *)((long)auVar1 + 8);
    if (lVar12 != 0) {
      local_78 = (Literal *)((long)auVar1 + 0x10);
      lVar13 = -0x18;
      lVar11 = 0;
      do {
        pLVar10 = (Literal *)(*(long *)((long)auVar1 + 0x28) + lVar13);
        if (lVar11 == 0) {
          pLVar10 = local_78;
        }
        ::wasm::Literal::Literal((Literal *)local_68,pLVar10);
        lVar7 = ::wasm::Literal::getInteger();
        if (0xffff < lVar7) {
          __assert_fail("u < 0x10000",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                        ,0x502,"Expression *wasm::Builder::makeConstantExpression(Literal)");
        }
        type.id._7_1_ = (undefined1)lVar7;
        std::__ostream_insert<char,std::char_traits<char>>(local_220,(char *)((long)&type.id + 7),1)
        ;
        type.id._7_1_ = (undefined1)((ulong)lVar7 >> 8);
        std::__ostream_insert<char,std::char_traits<char>>(local_220,(char *)((long)&type.id + 7),1)
        ;
        ::wasm::Literal::~Literal((Literal *)local_68);
        lVar11 = lVar11 + 1;
        lVar13 = lVar13 + 0x18;
      } while (lVar12 != lVar11);
    }
    std::__cxx11::stringbuf::str();
    EVar15 = (Expression)::wasm::IString::interned(c.field_0.i64,local_68,0);
    pEVar6 = (Expression *)MixedArena::allocSpace(&local_70->wasm->allocator,0x20,8);
    pEVar6->_id = StringConstId;
    (pEVar6->type).id = 0;
    pEVar6[1] = EVar15;
    ::wasm::StringConst::finalize();
    if (local_68 != (undefined1  [8])((long)&c.field_0 + 8)) {
      operator_delete((void *)local_68,(ulong)(c.field_0.func.super_IString.str._M_str + 1));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_230);
    std::ios_base::~ios_base(local_1b0);
    return pEVar6;
  }
  uVar9 = (uint)local_40.id & 1;
  if ((6 < local_40.id) && ((local_40.id & 1) == 0)) {
    HVar5 = Type::getHeapType(&local_40);
    if ((HVar5.id < 0x7d) && (((uint)HVar5.id & 0x7b) == 8)) {
      ::wasm::Literal::internalize();
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               makeConstantExpression(this,&local_90);
      pCVar4 = (Const *)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
      (pCVar4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id = RefAsId;
      (pCVar4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 0;
      (pCVar4->value).field_0.i32 = 2;
      (pCVar4->value).field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var8;
      ::wasm::RefAs::finalize();
      pLVar10 = &local_90;
      goto LAB_0017430b;
    }
    uVar9 = (uint)local_40.id & 1;
  }
  if (uVar9 == 0 || local_40.id < 7) {
    if (local_40.id < 7) {
      ::wasm::handle_unreachable
                ("unsupported constant expression",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                 ,0x50e);
    }
    __assertion = "type.isBasic() && \"TODO: handle compound types\"";
  }
  else {
    __assertion = "!type.isTuple() && \"Unexpected tuple type\"";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x50d,"Expression *wasm::Builder::makeConstantExpression(Literal)");
}

Assistant:

Expression* makeConstantExpression(Literal value) {
    auto type = value.type;
    if (type.isNumber()) {
      return makeConst(value);
    }
    if (value.isNull()) {
      return makeRefNull(type.getHeapType());
    }
    if (type.isFunction()) {
      return makeRefFunc(value.getFunc(), type.getHeapType());
    }
    if (type.isRef() && type.getHeapType().isMaybeShared(HeapType::i31)) {
      return makeRefI31(makeConst(value.geti31()),
                        type.getHeapType().getShared());
    }
    if (type.isString()) {
      // The string is already WTF-16, but we need to convert from `Literals` to
      // actual string.
      std::stringstream wtf16;
      for (auto c : value.getGCData()->values) {
        auto u = c.getInteger();
        assert(u < 0x10000);
        wtf16 << uint8_t(u & 0xFF);
        wtf16 << uint8_t(u >> 8);
      }
      // TODO: Use wtf16.view() once we have C++20.
      return makeStringConst(wtf16.str());
    }
    if (type.isRef() && type.getHeapType().isMaybeShared(HeapType::ext)) {
      return makeRefAs(ExternConvertAny,
                       makeConstantExpression(value.internalize()));
    }
    TODO_SINGLE_COMPOUND(type);
    WASM_UNREACHABLE("unsupported constant expression");
  }